

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O0

unsigned_long encode_carried(void)

{
  ulong local_10;
  unsigned_long c;
  
  local_10 = (ulong)((u.uhave._0_1_ & 1) != 0);
  if (((byte)u.uhave._0_1_ >> 1 & 1) != 0) {
    local_10 = local_10 | 2;
  }
  if (((byte)u.uhave._0_1_ >> 2 & 1) != 0) {
    local_10 = local_10 | 4;
  }
  if (((byte)u.uhave._0_1_ >> 3 & 1) != 0) {
    local_10 = local_10 | 8;
  }
  if (((byte)u.uhave._0_1_ >> 4 & 1) != 0) {
    local_10 = local_10 | 0x10;
  }
  return local_10;
}

Assistant:

static unsigned long encode_carried(void)
{
    unsigned long c = 0UL;

    if (u.uhave.amulet)		c |= 0x0001UL; /* real Amulet of Yendor */
    if (u.uhave.bell)		c |= 0x0002UL; /* Bell of Opening */
    if (u.uhave.book)		c |= 0x0004UL; /* Book of the Dead */
    if (u.uhave.menorah)	c |= 0x0008UL; /* Candelabrum of Invocation */
    if (u.uhave.questart)	c |= 0x0010UL; /* own quest artifact */

    return c;
}